

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O2

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  char cVar2;
  undefined4 uVar3;
  FT_Memory memory;
  FT_Stream stream_00;
  FT_Library __s2;
  FT_Bitmap_Size *pFVar4;
  FT_ULong count;
  FT_Pos FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  FT_Int FVar11;
  undefined8 uVar12;
  FT_Error FVar13;
  int iVar14;
  FT_String *pFVar15;
  size_t sVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  int iVar20;
  FT_Face pFVar21;
  uchar *puVar22;
  long lVar23;
  FT_Face pFVar24;
  FT_Face pFVar25;
  undefined8 *puVar26;
  FT_Error local_2cc;
  FT_Face local_2c8;
  FT_Face local_2c0;
  FT_Face local_2b8;
  FT_Face local_2b0 [2];
  int local_2a0;
  FT_Face local_298;
  FT_Int local_290;
  FT_Int local_28c;
  FT_String *local_288;
  FT_Parameter *local_280;
  FT_Pointer local_278;
  FT_Open_Args args;
  code *local_230;
  code *local_200;
  code *local_1f0;
  code *local_1e8;
  uchar *local_1d8;
  FT_ULong FStack_1d0;
  char local_1c8;
  FT_Int local_1c0;
  undefined1 local_1b8 [32];
  uint local_198;
  long local_190;
  code *local_160;
  uint local_158;
  FT_Pos local_150 [5];
  FT_GlyphSlot_conflict local_128;
  code *local_f8;
  FT_Generic_Finalizer local_f0 [3];
  long local_d8;
  FT_Size local_c8;
  FT_CharMap pFStack_c0;
  code *local_98;
  undefined1 local_90 [88];
  code *local_38;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  local_290 = num_params;
  local_278 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)local_278;
  local_288 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = local_288;
  if (local_288 == (FT_String *)0x0) {
    return 0xb;
  }
  memory = t42face->memory;
  local_28c = face_index;
  local_280 = params;
  memset(&args,0,0x240);
  pFVar15 = (FT_String *)ft_mem_alloc(memory,0xc,&local_2cc);
  t42face[3].style_name = pFVar15;
  FVar13 = local_2cc;
  if (local_2cc == 0) {
    *(undefined8 *)&t42face[3].num_fixed_sizes = 0xc;
    stream_00 = t42face->stream;
    (*(code *)**(undefined8 **)(local_288 + 8))(&args,0,0,memory);
    local_1d8 = (uchar *)0x0;
    FStack_1d0 = 0;
    local_1c8 = '\0';
    FVar13 = FT_Stream_Seek(stream_00,0);
    local_2b0[0] = (FT_Face)CONCAT44(local_2b0[0]._4_4_,FVar13);
    local_2c8 = t42face;
    if (FVar13 == 0) {
      FVar13 = FT_Stream_EnterFrame(stream_00,0x11);
      local_2b0[0] = (FT_Face)CONCAT44(local_2b0[0]._4_4_,FVar13);
      if (FVar13 != 0) goto LAB_00173ac8;
      iVar14 = bcmp(stream_00->cursor,"%!PS-TrueTypeFont",0x11);
      if (iVar14 == 0) {
        FVar13 = 0;
      }
      else {
        local_2b0[0] = (FT_Face)CONCAT44(local_2b0[0]._4_4_,2);
        FVar13 = 2;
      }
      FT_Stream_ExitFrame(stream_00);
      if (iVar14 != 0) goto LAB_00173ac8;
      FVar13 = FT_Stream_Seek(stream_00,0);
      local_2b0[0] = (FT_Face)CONCAT44(local_2b0[0]._4_4_,FVar13);
      if (FVar13 != 0) goto LAB_00173ac8;
      count = stream_00->size;
      if (stream_00->read != (FT_Stream_IoFunc)0x0) {
        local_1d8 = (uchar *)ft_mem_alloc(memory,count,(FT_Error *)local_2b0);
        FVar13 = (int)local_2b0[0];
        if ((int)local_2b0[0] == 0) {
          FVar13 = FT_Stream_Read(stream_00,local_1d8,count);
          local_2b0[0] = (FT_Face)CONCAT44(local_2b0[0]._4_4_,FVar13);
          if (FVar13 == 0) goto LAB_001743d5;
        }
        goto LAB_00173ac8;
      }
      local_1d8 = stream_00->base + stream_00->pos;
      local_1c8 = '\x01';
      FVar13 = FT_Stream_Skip(stream_00,count);
      local_2b0[0] = (FT_Face)CONCAT44(local_2b0[0]._4_4_,FVar13);
      FStack_1d0 = count;
      if (FVar13 != 0) goto LAB_00173ac8;
LAB_001743d5:
      args.memory_base = local_1d8;
      FStack_1d0 = count;
    }
    else {
LAB_00173ac8:
      if (local_1c8 == '\0') {
        ft_mem_free(memory,local_1d8);
        local_1d8 = (uchar *)0x0;
        FVar13 = (int)local_2b0[0];
      }
      t42face = local_2c8;
      if (FVar13 != 0) goto LAB_00173da2;
    }
    local_2cc = 0;
    args._0_8_ = local_1d8;
    puVar22 = local_1d8 + FStack_1d0;
    args.pathname._0_4_ = 0;
    args.memory_size = (FT_Long)puVar22;
    (*(code *)args.params)(&args);
    local_2b8 = (FT_Face)&local_2c8[2].extensions;
    local_2c0 = (FT_Face)&local_2c8[1].num_fixed_sizes;
    local_298 = local_2c8 + 1;
    while ((ulong)args._0_8_ < puVar22) {
      if ((*(char *)args._0_8_ == 'F') && ((uchar *)(args._0_8_ + 0x19) < puVar22)) {
        iVar14 = strncmp((char *)args._0_8_,"FontDirectory",0xd);
        if (iVar14 == 0) {
          (*local_230)(&args);
          (*(code *)args.params)(&args);
          uVar12 = args._0_8_;
          while ((ulong)args._0_8_ < puVar22) {
            if (((*(char *)args._0_8_ == 'k') && ((uchar *)(args._0_8_ + 5) < puVar22)) &&
               (iVar14 = strncmp((char *)args._0_8_,"known",5), iVar14 == 0)) {
              (*local_230)(&args);
              (*local_200)(&args,local_2b0);
              if (local_2a0 == 3) {
                uVar12 = args._0_8_;
              }
              break;
            }
            (*local_230)(&args);
            t42face = local_2c8;
            FVar13 = (int)args.pathname;
            if ((int)args.pathname != 0) goto LAB_00173da2;
            (*(code *)args.params)(&args);
          }
        }
        else {
LAB_00173cb1:
          (*local_230)(&args);
LAB_00173cc2:
          t42face = local_2c8;
          FVar13 = (int)args.pathname;
          uVar12 = args._0_8_;
          if ((int)args.pathname != 0) goto LAB_00173da2;
        }
      }
      else {
        if ((*(char *)args._0_8_ != '/') || (puVar22 <= (uchar *)(args._0_8_ + 2)))
        goto LAB_00173cb1;
        pcVar17 = (char *)(args._0_8_ + 1);
        args._0_8_ = pcVar17;
        (*local_230)(&args);
        t42face = local_2c8;
        FVar13 = (int)args.pathname;
        if ((int)args.pathname != 0) goto LAB_00173da2;
        uVar12 = args._0_8_;
        if (((int)(args._0_8_ - (long)pcVar17) - 1U < 0x15) && ((ulong)args._0_8_ < puVar22)) {
          uVar19 = args._0_8_ - (long)pcVar17 & 0xffffffff;
          for (lVar23 = 0; uVar12 = args._0_8_, lVar23 != 0x3c0; lVar23 = lVar23 + 0x30) {
            pcVar18 = *(char **)((long)&t42_keywords[0].ident + lVar23);
            if ((((pcVar18 != (char *)0x0) && (*pcVar17 == *pcVar18)) &&
                (sVar16 = strlen(pcVar18), uVar19 == sVar16)) &&
               (iVar14 = bcmp(pcVar17,pcVar18,uVar19), iVar14 == 0)) {
              iVar14 = *(int *)((long)&t42_keywords[0].type + lVar23);
              if (iVar14 == 0xb) {
                (**(code **)((long)&t42_keywords[0].reader + lVar23))(local_2c8,&args);
              }
              else {
                iVar20 = *(int *)((long)&t42_keywords[0].location + lVar23);
                local_2b0[0] = local_2c0;
                if ((iVar20 != 2) && (local_2b0[0] = local_2b8, iVar20 != 5)) {
                  local_2b0[0] = local_298;
                }
                if (iVar14 - 9U < 2) {
                  args.pathname._0_4_ = (*local_1e8)();
                }
                else {
                  args.pathname._0_4_ =
                       (*local_1f0)(&args,(long)&t42_keywords[0].ident + lVar23,local_2b0,0,0);
                }
              }
              goto LAB_00173cc2;
            }
          }
        }
      }
      args._0_8_ = uVar12;
      (*(code *)args.params)(&args);
    }
    local_2cc = (int)args.pathname;
    t42face = local_2c8;
    FVar13 = local_2cc;
    if ((int)args.pathname == 0) {
      if (*(char *)((long)&local_2c8[2].driver + 1) == '*') {
        local_2c8[2].max_advance_width = (undefined2)local_158;
        local_2c8[2].max_advance_height = local_158._2_2_;
        if (local_d8 == 0) {
          local_2cc = 3;
        }
        local_d8 = 0;
        local_2c8[2].generic.finalizer = local_f0[0];
        local_2c8[2].size = local_c8;
        local_2c8[2].charmap = pFStack_c0;
        local_2c8[2].bbox.xMin = local_150[0];
        local_2c8[2].glyph = local_128;
        local_150[0] = 0;
        local_128 = (FT_GlyphSlot_conflict)0x0;
        FVar13 = local_2cc;
        if (*(int *)&local_2c8[2].style_name == 1) {
          pFVar21 = (FT_Face)0x0;
          pFVar24 = (FT_Face)(ulong)local_158;
          if ((int)local_158 < 1) {
            pFVar24 = pFVar21;
          }
          local_298 = (FT_Face)(ulong)local_198;
          if ((int)local_198 < 1) {
            local_298 = pFVar21;
          }
          local_2b8 = (FT_Face)((ulong)local_2b8 & 0xffffffff00000000);
          local_2c0 = (FT_Face)((ulong)local_2c0 & 0xffffffff00000000);
          for (; pFVar21 != local_298; pFVar21 = (FT_Face)((long)&pFVar21->num_faces + 1)) {
            *(undefined2 *)(*(long *)&t42face[2].num_charmaps + (long)pFVar21 * 2) = 0;
            t42face[2].charmaps[(long)pFVar21] = (FT_CharMap)".notdef";
            pcVar17 = *(char **)(local_190 + (long)pFVar21 * 8);
            if (pcVar17 != (char *)0x0) {
              for (pFVar25 = (FT_Face)0x0; pFVar24 != pFVar25;
                  pFVar25 = (FT_Face)((long)&pFVar25->num_faces + 1)) {
                __s2 = (&(t42face[2].glyph)->library)[(long)pFVar25];
                iVar14 = strcmp(pcVar17,(char *)__s2);
                if (iVar14 == 0) {
                  *(short *)(*(long *)&local_2c8[2].num_charmaps + (long)pFVar21 * 2) =
                       (short)pFVar25;
                  local_2c8[2].charmaps[(long)pFVar21] = (FT_CharMap)__s2;
                  iVar14 = strcmp(".notdef",(char *)__s2);
                  t42face = local_2c8;
                  if (iVar14 != 0) {
                    iVar20 = (int)pFVar21;
                    iVar14 = (int)local_2b8;
                    if (iVar20 < (int)local_2b8) {
                      iVar14 = iVar20;
                    }
                    local_2b8 = (FT_Face)CONCAT44(local_2b8._4_4_,iVar14);
                    iVar14 = (int)local_2c0;
                    if ((long)(int)local_2c0 <= (long)pFVar21) {
                      iVar14 = iVar20 + 1;
                    }
                    local_2c0 = (FT_Face)CONCAT44(local_2c0._4_4_,iVar14);
                  }
                  break;
                }
                t42face = local_2c8;
              }
            }
          }
          *(int *)&t42face[2].field_0x3c = (int)local_2b8;
          *(int *)&t42face[2].available_sizes = (int)local_2c0;
          t42face[2].num_fixed_sizes = local_1c0;
          FVar13 = local_2cc;
        }
      }
      else {
        local_2cc = 2;
        FVar13 = local_2cc;
      }
    }
  }
LAB_00173da2:
  local_2cc = FVar13;
  if (local_160 != (code *)0x0) {
    (*local_160)(local_1b8);
  }
  FVar11 = local_28c;
  if (local_98 != (code *)0x0) {
    (*local_98)(local_f0);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(local_150);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(local_90);
  }
  if (local_1c8 == '\0') {
    ft_mem_free((FT_Memory)args.stream,local_1d8);
  }
  (*(code *)CONCAT44(args._52_4_,args.num_params))();
  if (FVar11 < 0 || local_2cc != 0) {
    return local_2cc;
  }
  if ((short)FVar11 != 0) {
    return 6;
  }
  iVar14._0_2_ = t42face[2].max_advance_width;
  iVar14._2_2_ = t42face[2].max_advance_height;
  t42face->num_glyphs = (long)iVar14;
  t42face->num_charmaps = 0;
  t42face->face_index = 0;
  t42face->face_flags =
       (ulong)(*(char *)&t42face[1].style_name != '\0') << 2 | t42face->face_flags | 0xa11;
  pcVar17 = (char *)t42face[1].style_flags;
  t42face->family_name = pcVar17;
  t42face->style_name = "Regular";
  if (pcVar17 == (char *)0x0) {
    if (t42face[2].family_name != (FT_String *)0x0) {
      t42face->family_name = t42face[2].family_name;
    }
  }
  else {
    pcVar18 = (char *)t42face[1].face_flags;
    if (pcVar18 != (char *)0x0) {
      do {
        cVar1 = *pcVar18;
        while( true ) {
          if (cVar1 == '\0') goto LAB_001740ea;
          cVar2 = *pcVar17;
          if (cVar1 == cVar2) break;
          if ((cVar1 == ' ') || (cVar1 == '-')) goto LAB_00173eed;
          if ((cVar2 != ' ') && (cVar2 != '-')) {
            if (cVar2 == '\0') {
              t42face->style_name = pcVar18;
            }
            goto LAB_001740ea;
          }
          pcVar17 = pcVar17 + 1;
        }
        pcVar17 = pcVar17 + 1;
LAB_00173eed:
        pcVar18 = pcVar18 + 1;
      } while( true );
    }
  }
LAB_001740ea:
  t42face->num_fixed_sizes = 0;
  t42face->available_sizes = (FT_Bitmap_Size *)0x0;
  args.flags = 9;
  args.driver = FT_Get_Module((t42face->driver->root).library,"truetype");
  args.memory_base = (FT_Byte *)t42face[3].style_name;
  args.memory_size = *(FT_Long *)&t42face[3].num_fixed_sizes;
  if (local_290 != 0) {
    args.flags = 0x19;
    args.num_params = local_290;
    args.params = local_280;
  }
  FVar13 = FT_Open_Face((t42face->driver->root).library,&args,0,
                        (FT_Face_conflict *)&t42face[3].available_sizes);
  if (FVar13 != 0) {
    return FVar13;
  }
  FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
  pFVar4 = t42face[3].available_sizes;
  FVar5 = pFVar4[3].x_ppem;
  FVar6 = pFVar4[3].y_ppem;
  FVar7 = *(FT_Pos *)(pFVar4 + 4);
  (t42face->bbox).xMin = pFVar4[3].size;
  (t42face->bbox).yMin = FVar5;
  (t42face->bbox).xMax = FVar6;
  (t42face->bbox).yMax = FVar7;
  uVar8 = *(undefined2 *)((long)&pFVar4[4].size + 2);
  uVar9 = *(undefined2 *)((long)&pFVar4[4].size + 4);
  uVar10 = *(undefined2 *)((long)&pFVar4[4].size + 6);
  t42face->units_per_EM = *(undefined2 *)&pFVar4[4].size;
  t42face->ascender = uVar8;
  t42face->descender = uVar9;
  t42face->height = uVar10;
  uVar3 = (undefined4)pFVar4[4].x_ppem;
  t42face->max_advance_width = (short)uVar3;
  t42face->max_advance_height = (short)((uint)uVar3 >> 0x10);
  uVar3 = *(undefined4 *)((long)&t42face[1].style_name + 2);
  t42face->underline_position = (short)uVar3;
  t42face->underline_thickness = (short)((uint)uVar3 >> 0x10);
  uVar19 = (ulong)(t42face[1].family_name != (FT_String *)0x0);
  t42face->style_flags = uVar19;
  if ((pFVar4->y_ppem & 2) != 0) {
    t42face->style_flags = uVar19 | 2;
  }
  if ((pFVar4->x_ppem & 0x20) != 0) {
    *(byte *)&t42face->face_flags = (byte)t42face->face_flags | 0x20;
  }
  if (local_278 == (FT_Pointer)0x0) {
switchD_00174260_default:
    FVar13 = 0;
  }
  else {
    puVar26 = *(undefined8 **)(local_288 + 0x40);
    args.memory_base = (FT_Byte *)0x10003756e6963;
    args._0_8_ = t42face;
    FVar13 = FT_CMap_New((FT_CMap_Class)puVar26[3],(FT_Pointer)0x0,(FT_CharMap)&args,
                         (FT_CMap_conflict *)0x0);
    if (FVar13 != 0 && (char)FVar13 != -0x5d) {
      return FVar13;
    }
    switch(*(undefined4 *)&t42face[2].style_name) {
    case 1:
      args.memory_base = (FT_Byte *)0x2000741444243;
      puVar26 = puVar26 + 2;
      break;
    case 2:
      args.memory_base = (FT_Byte *)0x741444f42;
      break;
    case 3:
      puVar26 = puVar26 + 3;
      args.memory_base = (FT_Byte *)0x300076c617431;
      break;
    case 4:
      args.memory_base = (FT_Byte *)0x1000741444245;
      puVar26 = puVar26 + 1;
      break;
    default:
      goto switchD_00174260_default;
    }
    FVar13 = 0;
    if ((FT_CMap_Class)*puVar26 != (FT_CMap_Class)0x0) {
      FVar13 = FT_CMap_New((FT_CMap_Class)*puVar26,(FT_Pointer)0x0,(FT_CharMap)&args,
                           (FT_CMap_conflict *)0x0);
    }
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }